

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-similarities.cc
# Opt level: O0

void __thiscall
dynet::DotProduct::backward_dev_impl<dynet::Device_CPU>
          (DotProduct *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  const_reference ppTVar3;
  uint *puVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RCX;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  uint in_R9D;
  long in_stack_00000008;
  array<int,_2> batchcast;
  array<int,_1> red_axis;
  array<int,_2> bcast_1;
  array<int,_1> bcast;
  DefaultDevice *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  value_type_conflict1 vVar7;
  undefined4 in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
  *in_stack_fffffffffffffca0;
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  *in_stack_fffffffffffffca8;
  Tensor *in_stack_fffffffffffffcb0;
  TensorBase<Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  *in_stack_fffffffffffffcb8;
  TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
  *in_stack_fffffffffffffcf8;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffd00;
  TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>
  *in_stack_fffffffffffffd18;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffd20;
  
  if (*(int *)(in_RCX + 0x20) == 1) {
    ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,(ulong)in_R9D);
    uVar1 = Dim::batch_size(&(*ppTVar3)->d);
    puVar4 = (uint *)std::array<int,_1UL>::operator[]
                               ((array<int,_1UL> *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (size_type)in_stack_fffffffffffffc88);
    *puVar4 = uVar1;
    std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
              (in_RDX,(ulong)(1 - in_R9D));
    Tensor::tvec((Tensor *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    Tensor::tvec((Tensor *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,0>::
    broadcast<std::array<int,1ul>>
              (in_stack_fffffffffffffca0,
               (array<int,_1UL> *)CONCAT44(uVar1,in_stack_fffffffffffffc98));
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,0>::
    operator*((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
               *)in_stack_fffffffffffffcb8,
              (TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>
               *)in_stack_fffffffffffffcb0);
    Tensor::tvec((Tensor *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
    ::device<Eigen::DefaultDevice>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
                *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator+=(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  else {
    ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,(ulong)in_R9D);
    uVar2 = Dim::batch_size(&(*ppTVar3)->d);
    puVar4 = (uint *)std::array<int,_2UL>::operator[]
                               ((array<int,_2UL> *)CONCAT44(uVar2,in_stack_fffffffffffffc90),
                                (size_type)in_stack_fffffffffffffc88);
    *puVar4 = uVar2;
    pvVar5 = std::array<int,_2UL>::operator[]
                       ((array<int,_2UL> *)CONCAT44(uVar2,in_stack_fffffffffffffc90),
                        (size_type)in_stack_fffffffffffffc88);
    *pvVar5 = 1;
    ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,0);
    uVar1 = ((*ppTVar3)->d).bd;
    ppTVar3 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                        (in_RDX,1);
    if (uVar1 == ((*ppTVar3)->d).bd) {
      std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                (in_RDX,(ulong)(1 - in_R9D));
      Tensor::tbvec(in_stack_fffffffffffffcb0);
      Tensor::tbvec(in_stack_fffffffffffffcb0);
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
      broadcast<std::array<int,2ul>>
                ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                  *)in_stack_fffffffffffffca0,
                 (array<int,_2UL> *)CONCAT44(in_stack_fffffffffffffc9c,uVar1));
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
      operator*((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                 *)in_stack_fffffffffffffcb8,
                (TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
                 *)in_stack_fffffffffffffcb0);
      Tensor::tbvec(in_stack_fffffffffffffcb0);
      Eigen::
      TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>::
      device<Eigen::DefaultDevice>
                ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                  *)CONCAT44(uVar2,in_stack_fffffffffffffc90),in_stack_fffffffffffffc88);
      Eigen::
      TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
      ::operator+=(in_stack_fffffffffffffd20,&in_stack_fffffffffffffd18->m_expr);
    }
    else if (*(int *)(in_stack_00000008 + 0x20) == 1) {
      pvVar6 = std::array<int,_1UL>::operator[]
                         ((array<int,_1UL> *)CONCAT44(uVar2,in_stack_fffffffffffffc90),
                          (size_type)in_stack_fffffffffffffc88);
      *pvVar6 = 1;
      std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                (in_RDX,(ulong)(1 - in_R9D));
      Tensor::tbvec(in_stack_fffffffffffffcb0);
      Tensor::tbvec(in_stack_fffffffffffffcb0);
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
      broadcast<std::array<int,2ul>>
                ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                  *)in_stack_fffffffffffffca0,
                 (array<int,_2UL> *)CONCAT44(in_stack_fffffffffffffc9c,uVar1));
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
      operator*((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                 *)in_stack_fffffffffffffcb8,
                (TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
                 *)in_stack_fffffffffffffcb0);
      Eigen::
      TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const,Eigen::TensorBroadcastingOp<std::array<int,2ul>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const>const>,0>
      ::sum<std::array<int,1ul>>
                (in_stack_fffffffffffffca8,(array<int,_1UL> *)in_stack_fffffffffffffca0);
      Tensor::tvec((Tensor *)CONCAT44(uVar2,in_stack_fffffffffffffc90));
      Eigen::
      TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>::
      device<Eigen::DefaultDevice>
                ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
                  *)CONCAT44(uVar2,in_stack_fffffffffffffc90),in_stack_fffffffffffffc88);
      Eigen::
      TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
      ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                    *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    else {
      pvVar5 = std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)CONCAT44(uVar2,in_stack_fffffffffffffc90),
                          (size_type)in_stack_fffffffffffffc88);
      *pvVar5 = 1;
      vVar7 = *(value_type_conflict1 *)(in_RCX + 0x20);
      pvVar5 = std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)CONCAT44(uVar2,vVar7),
                          (size_type)in_stack_fffffffffffffc88);
      *pvVar5 = vVar7;
      std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                (in_RDX,(ulong)(1 - in_R9D));
      Tensor::tbvec(in_stack_fffffffffffffcb0);
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
      broadcast<std::array<int,2ul>>
                ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                  *)in_stack_fffffffffffffca0,
                 (array<int,_2UL> *)CONCAT44(in_stack_fffffffffffffc9c,uVar1));
      Tensor::tbvec(in_stack_fffffffffffffcb0);
      Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
      broadcast<std::array<int,2ul>>
                ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                  *)in_stack_fffffffffffffca0,
                 (array<int,_2UL> *)CONCAT44(in_stack_fffffffffffffc9c,uVar1));
      Eigen::
      TensorBase<Eigen::TensorBroadcastingOp<std::array<int,2ul>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const>,0>
      ::operator*(in_stack_fffffffffffffcb8,
                  (TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
                   *)in_stack_fffffffffffffcb0);
      Tensor::tbvec(in_stack_fffffffffffffcb0);
      Eigen::
      TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>::
      device<Eigen::DefaultDevice>
                ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                  *)CONCAT44(uVar2,vVar7),in_stack_fffffffffffffc88);
      Eigen::
      TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
      ::operator+=(in_stack_fffffffffffffd20,
                   (TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
                    *)in_stack_fffffffffffffd18);
    }
  }
  return;
}

Assistant:

void DotProduct::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  if(fx.d.bd == 1) {
    Eigen::array<int, 1> bcast; bcast[0] = xs[i]->d.batch_size();
    dEdxi.tvec().device(*dev.edevice) += xs[1-i]->tvec() * dEdf.tvec().broadcast(bcast);
  } else {
    Eigen::array<int, 2> bcast; bcast[0] =xs[i]->d.batch_size(); bcast[1] = 1;
    if(xs[0]->d.bd == xs[1]->d.bd) {
      dEdxi.tbvec().device(*dev.edevice) += xs[1-i]->tbvec() * dEdf.tbvec().broadcast(bcast);
    } else if(dEdxi.d.bd == 1) {
      Eigen::array<int, 1> red_axis; red_axis[0] = 1;
      dEdxi.tvec().device(*dev.edevice) += (xs[1-i]->tbvec() * dEdf.tbvec().broadcast(bcast)).sum(red_axis);
    } else {
      Eigen::array<int, 2> batchcast; batchcast[0] = 1; batchcast[1] = fx.d.bd;
      dEdxi.tbvec().device(*dev.edevice) += (xs[1-i]->tbvec().broadcast(batchcast) * dEdf.tbvec().broadcast(bcast));
    }
  }
}